

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void update_statusline_aux(wchar_t row,wchar_t col)

{
  size_t sVar1;
  ulong local_18;
  size_t i;
  wchar_t col_local;
  wchar_t row_local;
  
  prt("",row,col);
  i._0_4_ = col;
  for (local_18 = 0; local_18 < 0xd; local_18 = local_18 + 1) {
    sVar1 = (*status_handlers[local_18])(row,(wchar_t)i);
    i._0_4_ = (wchar_t)i + (int)sVar1;
  }
  return;
}

Assistant:

static void update_statusline_aux(int row, int col)
{
	size_t i;

	/* Clear the remainder of the line */
	prt("", row, col);

	/* Display those which need redrawing */
	for (i = 0; i < N_ELEMENTS(status_handlers); i++)
		col += status_handlers[i](row, col);
}